

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O1

void __thiscall rengine::TestBase::addTest(TestBase *this,StaticRenderTest *test)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  
  p_Var2 = (_List_node_base *)operator_new(0x18);
  p_Var2[1]._M_next = (_List_node_base *)test;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(this->tests).
            super__List_base<rengine::StaticRenderTest_*,_std::allocator<rengine::StaticRenderTest_*>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  (*((this->super_StandardSurface).super_Surface.m_impl)->_vptr_SurfaceBackendImpl[8])();
  return;
}

Assistant:

void addTest(StaticRenderTest *test) {
        tests.push_back(test);
        requestRender();
    }